

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void par_shapes__trefoil(float *uv,float *xyz,void *userdata)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  fVar1 = *userdata;
  fVar11 = (1.0 - *uv) * 4.0 * 3.1415927;
  fVar2 = uv[1];
  dVar15 = (double)(fVar11 * 1.5);
  dVar3 = cos(dVar15);
  dVar4 = (double)fVar11;
  dVar5 = cos(dVar4);
  dVar6 = sin(dVar4);
  dVar7 = sin(dVar15);
  dVar8 = sin(dVar15);
  dVar16 = cos(dVar4);
  dVar9 = cos(dVar15);
  dVar10 = sin(dVar4);
  fVar11 = (float)(dVar16 * dVar8 * -0.45000001788139343 -
                  dVar10 * (dVar9 * 0.30000001192092896 + 0.5));
  dVar8 = sin(dVar15);
  dVar16 = sin(dVar4);
  dVar9 = cos(dVar15);
  dVar4 = cos(dVar4);
  fVar12 = (float)(dVar16 * dVar8 * -0.45000001788139343 +
                  dVar4 * (dVar9 * 0.30000001192092896 + 0.5));
  dVar15 = cos(dVar15);
  fVar21 = (float)(dVar15 * 0.75);
  fVar13 = fVar21 * fVar21 + fVar11 * fVar11 + fVar12 * fVar12;
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  dVar15 = (double)(float)(dVar3 * 0.30000001192092896 + 0.5);
  fVar17 = 1.0 / fVar13;
  if (0.0 < fVar13) {
    fVar11 = fVar11 * fVar17;
    fVar12 = fVar12 * fVar17;
  }
  fVar21 = (float)(~-(uint)(0.0 < fVar13) & (uint)fVar21 |
                  (uint)(fVar17 * fVar21) & -(uint)(0.0 < fVar13));
  fVar17 = -fVar11;
  fVar13 = fVar12 * fVar12 + fVar11 * fVar11;
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  fVar19 = 1.0 / fVar13;
  fVar18 = (float)(-(uint)(0.0 < fVar13) & (uint)(fVar19 * 0.0));
  fVar14 = fVar12;
  fVar20 = fVar17;
  if (0.0 < fVar13) {
    fVar14 = fVar19 * fVar12;
    fVar20 = fVar19 * fVar17;
  }
  dVar16 = (double)(fVar1 * 0.1);
  dVar3 = (double)((fVar2 + fVar2) * 3.1415927);
  dVar4 = cos(dVar3);
  dVar8 = sin(dVar3);
  *xyz = (float)((dVar4 * (double)fVar14 + dVar8 * (double)(fVar12 * fVar18 - fVar20 * fVar21)) *
                 dVar16 + (double)(float)(dVar5 * dVar15));
  dVar4 = cos(dVar3);
  dVar5 = sin(dVar3);
  xyz[1] = (float)((dVar4 * (double)fVar20 + dVar5 * (double)(fVar21 * fVar14 + fVar17 * fVar18)) *
                   dVar16 + (double)(float)(dVar6 * dVar15));
  dVar15 = sin(dVar3);
  xyz[2] = (float)(dVar15 * (double)((fVar11 * fVar20 - fVar14 * fVar12) * fVar1 * 0.1) +
                  (double)(float)(dVar7 * 0.5));
  return;
}

Assistant:

static void par_shapes__trefoil(float const* uv, float* xyz, void* userdata)
{
    float minor = *((float*) userdata);
    const float a = 0.5f;
    const float b = 0.3f;
    const float c = 0.5f;
    const float d = minor * 0.1f;
    const float u = (1 - uv[0]) * 4 * PAR_PI;
    const float v = uv[1] * 2 * PAR_PI;
    const float r = a + b * cos(1.5f * u);
    const float x = r * cos(u);
    const float y = r * sin(u);
    const float z = c * sin(1.5f * u);
    float q[3];
    q[0] =
        -1.5f * b * sin(1.5f * u) * cos(u) - (a + b * cos(1.5f * u)) * sin(u);
    q[1] =
        -1.5f * b * sin(1.5f * u) * sin(u) + (a + b * cos(1.5f * u)) * cos(u);
    q[2] = 1.5f * c * cos(1.5f * u);
    par_shapes__normalize3(q);
    float qvn[3] = {q[1], -q[0], 0};
    par_shapes__normalize3(qvn);
    float ww[3];
    par_shapes__cross3(ww, q, qvn);
    xyz[0] = x + d * (qvn[0] * cos(v) + ww[0] * sin(v));
    xyz[1] = y + d * (qvn[1] * cos(v) + ww[1] * sin(v));
    xyz[2] = z + d * ww[2] * sin(v);
}